

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_meshlink_edge_improve(REF_GRID ref_grid,REF_INT node)

{
  REF_DBL *pRVar1;
  REF_INTERP pRVar2;
  uint uVar3;
  uint uVar4;
  int local_138;
  int local_134;
  int local_130;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INTERP ref_interp;
  REF_INT interp_guess;
  REF_STATUS interp_status;
  REF_BOOL geom_edge;
  REF_BOOL allowed;
  REF_INT ixyz;
  REF_DBL normdev_orig;
  REF_DBL normdev;
  REF_DBL tet_quality;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL quality;
  REF_DBL backoff;
  REF_DBL original [3];
  double dStack_78;
  REF_DBL ideal [3];
  REF_DBL local_58;
  REF_DBL total_force [3];
  int local_34;
  int local_30;
  REF_INT tries;
  REF_INT node1;
  REF_INT node0;
  REF_NODE ref_node;
  REF_GRID pRStack_18;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  _node1 = ref_grid->node;
  pRVar2 = ref_grid->interp;
  ref_node._4_4_ = node;
  pRStack_18 = ref_grid;
  if (ref_grid->geom->meshlink == (void *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x35f,
           "ref_smooth_meshlink_edge_improve","expect meshlink");
    ref_grid_local._4_4_ = 1;
  }
  else {
    if ((node < 0) || (ref_grid->cell[0]->ref_adj->nnode <= node)) {
      local_130 = -1;
    }
    else {
      local_130 = ref_grid->cell[0]->ref_adj->first[node];
    }
    if (local_130 == -1) {
      if ((node < 0) || (ref_grid->cell[6]->ref_adj->nnode <= node)) {
        local_134 = -1;
      }
      else {
        local_134 = ref_grid->cell[6]->ref_adj->first[node];
      }
      if (local_134 == -1) {
        uVar3 = ref_geom_is_a(ref_grid->geom,node,1,&interp_guess);
        if (uVar3 == 0) {
          if (interp_guess == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            uVar3 = ref_smooth_edge_neighbors(pRStack_18,ref_node._4_4_,&tries,&local_30);
            if (uVar3 == 0) {
              if (local_30 == -1) {
                ref_grid_local._4_4_ = 0;
              }
              else {
                for (geom_edge = 0; geom_edge < 3; geom_edge = geom_edge + 1) {
                  total_force[(long)geom_edge + -1] = 0.0;
                }
                uVar3 = ref_smooth_add_pliant_force(_node1,ref_node._4_4_,tries,&local_58);
                if (uVar3 == 0) {
                  uVar3 = ref_smooth_add_pliant_force(_node1,ref_node._4_4_,local_30,&local_58);
                  if (uVar3 == 0) {
                    for (geom_edge = 0; geom_edge < 3; geom_edge = geom_edge + 1) {
                      ideal[(long)geom_edge + -1] =
                           pRStack_18->adapt->smooth_pliant_alpha *
                           total_force[(long)geom_edge + -1] +
                           _node1->real[geom_edge + ref_node._4_4_ * 0xf];
                    }
                    for (geom_edge = 0; geom_edge < 3; geom_edge = geom_edge + 1) {
                      original[(long)geom_edge + -1] =
                           _node1->real[geom_edge + ref_node._4_4_ * 0xf];
                    }
                    uVar3 = ref_smooth_tri_normdev_around
                                      (pRStack_18,ref_node._4_4_,(REF_DBL *)&allowed);
                    if (uVar3 == 0) {
                      ref_interp._4_4_ = -1;
                      if ((pRVar2 != (REF_INTERP)0x0) && (pRVar2->continuously != 0)) {
                        ref_interp._4_4_ = pRVar2->cell[ref_node._4_4_];
                      }
                      quality = 1.0;
                      for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
                        for (geom_edge = 0; geom_edge < 3; geom_edge = geom_edge + 1) {
                          _node1->real[geom_edge + ref_node._4_4_ * 0xf] =
                               quality * ideal[(long)geom_edge + -1] +
                               (1.0 - quality) * original[(long)geom_edge + -1];
                        }
                        uVar3 = ref_geom_constrain(pRStack_18,ref_node._4_4_);
                        if (uVar3 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x385,"ref_smooth_meshlink_edge_improve",(ulong)uVar3,"constrain")
                          ;
                          return uVar3;
                        }
                        uVar3 = ref_metric_interpolate_node(pRStack_18,ref_node._4_4_);
                        if ((uVar3 != 0) && (uVar3 != 5)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x387,"ref_smooth_meshlink_edge_improve",(ulong)uVar3,
                                 "ref_metric_interpolate_node failed");
                          return uVar3;
                        }
                        if (uVar3 == 0) {
                          uVar4 = ref_smooth_valid_no_geom_tri
                                            (pRStack_18,ref_node._4_4_,&interp_status);
                          if (uVar4 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x389,"ref_smooth_meshlink_edge_improve",(ulong)uVar4,"normals")
                            ;
                            return uVar4;
                          }
                          if (interp_status != 0) {
                            uVar4 = ref_metric_interpolate_node(pRStack_18,ref_node._4_4_);
                            if (uVar4 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x38b,"ref_smooth_meshlink_edge_improve",(ulong)uVar4,
                                     "interp node");
                              return uVar4;
                            }
                            uVar4 = ref_smooth_tri_quality_around
                                              (pRStack_18,ref_node._4_4_,&min_ratio);
                            if (uVar4 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x38c,"ref_smooth_meshlink_edge_improve",(ulong)uVar4,"q");
                              return uVar4;
                            }
                            uVar4 = ref_smooth_tri_ratio_around
                                              (pRStack_18,ref_node._4_4_,&max_ratio,&tet_quality);
                            if (uVar4 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x38e,"ref_smooth_meshlink_edge_improve",(ulong)uVar4,"ratio")
                              ;
                              return uVar4;
                            }
                            uVar4 = ref_smooth_tri_normdev_around
                                              (pRStack_18,ref_node._4_4_,&normdev_orig);
                            if (uVar4 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x38f,"ref_smooth_meshlink_edge_improve",(ulong)uVar4,"nd");
                              return uVar4;
                            }
                            pRVar1 = &pRStack_18->adapt->smooth_min_quality;
                            if ((((*pRVar1 <= min_ratio && min_ratio != *pRVar1) &&
                                 (pRStack_18->adapt->post_min_ratio <= max_ratio)) &&
                                (tet_quality <= pRStack_18->adapt->post_max_ratio)) &&
                               ((pRVar1 = &pRStack_18->adapt->post_min_normdev,
                                *pRVar1 <= normdev_orig && normdev_orig != *pRVar1 ||
                                (_allowed < normdev_orig)))) {
                              if ((ref_node._4_4_ < 0) ||
                                 (pRStack_18->cell[8]->ref_adj->nnode <= ref_node._4_4_)) {
                                local_138 = -1;
                              }
                              else {
                                local_138 = pRStack_18->cell[8]->ref_adj->first[ref_node._4_4_];
                              }
                              if (local_138 == -1) {
                                return 0;
                              }
                              uVar4 = ref_smooth_tet_quality_around
                                                (pRStack_18,ref_node._4_4_,&normdev);
                              if (uVar4 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                       ,0x39a,"ref_smooth_meshlink_edge_improve",(ulong)uVar4,"q");
                                return uVar4;
                              }
                              uVar4 = ref_smooth_tet_ratio_around
                                                (pRStack_18,ref_node._4_4_,&max_ratio,&tet_quality);
                              if (uVar4 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                       ,0x39d,"ref_smooth_meshlink_edge_improve",(ulong)uVar4,
                                       "ratio");
                                return uVar4;
                              }
                              pRVar1 = &pRStack_18->adapt->smooth_min_quality;
                              if (((*pRVar1 <= normdev && normdev != *pRVar1) &&
                                  (pRStack_18->adapt->post_min_ratio <= max_ratio)) &&
                                 (tet_quality <= pRStack_18->adapt->post_max_ratio)) {
                                return 0;
                              }
                            }
                          }
                        }
                        quality = quality * 0.5;
                        if ((ref_interp._4_4_ != -1) && (uVar3 != 0)) {
                          pRVar2->cell[ref_node._4_4_] = ref_interp._4_4_;
                        }
                      }
                      for (geom_edge = 0; geom_edge < 3; geom_edge = geom_edge + 1) {
                        _node1->real[geom_edge + ref_node._4_4_ * 0xf] =
                             original[(long)geom_edge + -1];
                      }
                      ref_grid_local._4_4_ = ref_metric_interpolate_node(pRStack_18,ref_node._4_4_);
                      if ((ref_grid_local._4_4_ == 0) || (ref_grid_local._4_4_ == 5)) {
                        ref_grid_local._4_4_ = 0;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,0x3af,"ref_smooth_meshlink_edge_improve",(ulong)ref_grid_local._4_4_
                               ,"interp");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                             ,0x378,"ref_smooth_meshlink_edge_improve",(ulong)uVar3,"nd_orig");
                      ref_grid_local._4_4_ = uVar3;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x36f,"ref_smooth_meshlink_edge_improve",(ulong)uVar3,"n1");
                    ref_grid_local._4_4_ = uVar3;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x36e,"ref_smooth_meshlink_edge_improve",(ulong)uVar3,"n0");
                  ref_grid_local._4_4_ = uVar3;
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x36a,"ref_smooth_meshlink_edge_improve",(ulong)uVar3,"edge nodes");
              ref_grid_local._4_4_ = uVar3;
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x367,"ref_smooth_meshlink_edge_improve",(ulong)uVar3,"edge check");
          ref_grid_local._4_4_ = uVar3;
        }
      }
      else {
        ref_grid_local._4_4_ = 0;
      }
    }
    else {
      ref_grid_local._4_4_ = 0;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_meshlink_edge_improve(REF_GRID ref_grid,
                                                           REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node0, node1;
  REF_INT tries;
  REF_DBL total_force[3];
  REF_DBL ideal[3], original[3];
  REF_DBL backoff, quality, min_ratio, max_ratio, tet_quality;
  REF_DBL normdev, normdev_orig;
  REF_INT ixyz;
  REF_BOOL allowed, geom_edge;
  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);

  RAS(ref_geom_meshlinked(ref_grid_geom(ref_grid)), "expect meshlink");

  /* geom edge only */
  if (!ref_cell_node_empty(ref_grid_edg(ref_grid), node)) return REF_SUCCESS;
  /* protect mixed-element quads */
  if (!ref_cell_node_empty(ref_grid_qua(ref_grid), node)) return REF_SUCCESS;
  /* require geometry */
  RSS(ref_geom_is_a(ref_grid_geom(ref_grid), node, REF_GEOM_EDGE, &geom_edge),
      "edge check");
  if (!geom_edge) return REF_SUCCESS;

  RSS(ref_smooth_edge_neighbors(ref_grid, node, &node0, &node1), "edge nodes");
  if (REF_EMPTY == node1) return REF_SUCCESS;

  for (ixyz = 0; ixyz < 3; ixyz++) total_force[ixyz] = 0.0;
  RSS(ref_smooth_add_pliant_force(ref_node, node, node0, total_force), "n0");
  RSS(ref_smooth_add_pliant_force(ref_node, node, node1, total_force), "n1");

  for (ixyz = 0; ixyz < 3; ixyz++)
    ideal[ixyz] =
        ref_node_xyz(ref_node, ixyz, node) +
        ref_grid_adapt(ref_grid, smooth_pliant_alpha) * total_force[ixyz];

  for (ixyz = 0; ixyz < 3; ixyz++)
    original[ixyz] = ref_node_xyz(ref_node, ixyz, node);
  RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev_orig), "nd_orig");
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ref_node_xyz(ref_node, ixyz, node) =
          backoff * ideal[ixyz] + (1.0 - backoff) * original[ixyz];
    RSS(ref_geom_constrain(ref_grid, node), "constrain");
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");
    if (REF_SUCCESS == interp_status) {
      RSS(ref_smooth_valid_no_geom_tri(ref_grid, node, &allowed), "normals");
      if (allowed) {
        RSS(ref_metric_interpolate_node(ref_grid, node), "interp node");
        RSS(ref_smooth_tri_quality_around(ref_grid, node, &quality), "q");
        RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
            "ratio");
        RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev), "nd");

        if ((quality > ref_grid_adapt(ref_grid, smooth_min_quality)) &&
            (min_ratio >= ref_grid_adapt(ref_grid, post_min_ratio)) &&
            (max_ratio <= ref_grid_adapt(ref_grid, post_max_ratio)) &&
            (normdev > ref_grid_adapt(ref_grid, post_min_normdev) ||
             normdev > normdev_orig)) {
          if (ref_cell_node_empty(ref_grid_tet(ref_grid), node)) {
            return REF_SUCCESS;
          } else {
            RSS(ref_smooth_tet_quality_around(ref_grid, node, &tet_quality),
                "q");
            RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio,
                                            &max_ratio),
                "ratio");
            if ((REF_SUCCESS == interp_status) &&
                (tet_quality > ref_grid_adapt(ref_grid, smooth_min_quality)) &&
                (min_ratio >= ref_grid_adapt(ref_grid, post_min_ratio)) &&
                (max_ratio <= ref_grid_adapt(ref_grid, post_max_ratio))) {
              return REF_SUCCESS;
            }
          }
        }
      }
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  for (ixyz = 0; ixyz < 3; ixyz++)
    ref_node_xyz(ref_node, ixyz, node) = original[ixyz];
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  return REF_SUCCESS;
}